

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

Float pbrt::HairBxDF::Mp(Float cosTheta_i,Float cosTheta_o,Float sinTheta_i,Float sinTheta_o,Float v
                        )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int64_t ifact;
  long lVar3;
  int i4;
  float fVar4;
  uint uVar5;
  int i;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar11 = (cosTheta_i * cosTheta_o) / v;
  fVar9 = (sinTheta_i * sinTheta_o) / v;
  if (v <= 0.1) {
    if (fVar11 <= 12.0) {
      fVar10 = 1.0;
      fVar4 = 0.0;
      lVar3 = 1;
      uVar5 = 1;
      iVar6 = 0;
      do {
        uVar7 = iVar6 + (uint)(iVar6 == 0);
        iVar6 = iVar6 + 1;
        lVar3 = lVar3 * (ulong)uVar7;
        uVar8 = (ulong)uVar5;
        uVar5 = uVar5 << 2;
        fVar12 = fVar10 / (float)(long)(uVar8 * lVar3 * lVar3);
        fVar10 = fVar11 * fVar11 * fVar10;
        fVar4 = fVar4 + fVar12;
      } while (iVar6 != 10);
      fVar11 = logf(fVar4);
    }
    else {
      fVar4 = logf(1.0 / fVar11);
      auVar1 = vfmadd132ss_fma(ZEXT416((uint)(1.0 / (fVar11 * 8.0) + fVar4 + -1.837877)),
                               ZEXT416((uint)fVar11),ZEXT416(0x3f000000));
      fVar11 = auVar1._0_4_;
    }
    fVar4 = logf(1.0 / (v + v));
    fVar9 = (fVar4 + ((fVar11 - fVar9) - 1.0 / v) + 0.6931) * 1.442695;
    auVar1 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
    fVar9 = fVar9 - auVar1._0_4_;
    auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar9),ZEXT416(0x3e679a0b)
                            );
    auVar2 = vfmadd213ss_fma(auVar2,ZEXT416((uint)fVar9),ZEXT416(0x3f321004));
    auVar2 = vfmadd213ss_fma(auVar2,ZEXT416((uint)fVar9),ZEXT416(0x3f800000));
    fVar9 = 0.0;
    iVar6 = (int)auVar1._0_4_ + -0x7f + (auVar2._0_4_ >> 0x17);
    if (-0x7f < iVar6) {
      if (iVar6 < 0x80) {
        fVar9 = (float)(iVar6 * 0x800000 + 0x3f800000U | auVar2._0_4_ & 0x807fffff);
      }
      else {
        fVar9 = INFINITY;
      }
    }
  }
  else {
    fVar9 = fVar9 * -1.442695;
    auVar1 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
    fVar9 = fVar9 - auVar1._0_4_;
    auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar9),ZEXT416(0x3e679a0b)
                            );
    auVar2 = vfmadd213ss_fma(auVar2,ZEXT416((uint)fVar9),ZEXT416(0x3f321004));
    auVar2 = vfmadd213ss_fma(auVar2,ZEXT416((uint)fVar9),ZEXT416(0x3f800000));
    fVar9 = 0.0;
    fVar4 = 0.0;
    iVar6 = (int)auVar1._0_4_ + -0x7f + (auVar2._0_4_ >> 0x17);
    if (-0x7f < iVar6) {
      if (iVar6 < 0x80) {
        fVar4 = (float)(iVar6 * 0x800000 + 0x3f800000U | auVar2._0_4_ & 0x807fffff);
      }
      else {
        fVar4 = INFINITY;
      }
    }
    fVar10 = 1.0;
    lVar3 = 1;
    uVar5 = 1;
    iVar6 = 0;
    do {
      uVar7 = iVar6 + (uint)(iVar6 == 0);
      iVar6 = iVar6 + 1;
      lVar3 = lVar3 * (ulong)uVar7;
      uVar8 = (ulong)uVar5;
      uVar5 = uVar5 << 2;
      fVar12 = fVar10 / (float)(long)(uVar8 * lVar3 * lVar3);
      fVar10 = fVar11 * fVar11 * fVar10;
      fVar9 = fVar9 + fVar12;
    } while (iVar6 != 10);
    fVar11 = sinhf(1.0 / v);
    fVar9 = (fVar4 * fVar9) / ((fVar11 + fVar11) * v);
  }
  if ((uint)ABS(fVar9) < 0x7f800000) {
    return fVar9;
  }
  LogFatal<char_const(&)[25]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.h"
             ,0x3ec,"Check failed: %s",(char (*) [25])"!IsInf(mp) && !IsNaN(mp)");
}

Assistant:

PBRT_CPU_GPU
    static Float Mp(Float cosTheta_i, Float cosTheta_o, Float sinTheta_i,
                    Float sinTheta_o, Float v) {
        Float a = cosTheta_i * cosTheta_o / v;
        Float b = sinTheta_i * sinTheta_o / v;
        Float mp = (v <= .1)
                       ? (FastExp(LogI0(a) - b - 1 / v + 0.6931f + std::log(1 / (2 * v))))
                       : (FastExp(-b) * I0(a)) / (std::sinh(1 / v) * 2 * v);
        CHECK(!IsInf(mp) && !IsNaN(mp));
        return mp;
    }